

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall libtorrent::tracker_alert::tracker_alert(tracker_alert *this,tracker_alert *param_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  torrent_alert::torrent_alert(&this->super_torrent_alert,&param_1->super_torrent_alert);
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__torrent_alert_004c5300;
  uVar1 = *(undefined8 *)&param_1->field_0x34;
  uVar2 = *(undefined8 *)&param_1->field_0x38;
  uVar3 = *(undefined8 *)&param_1->field_0x40;
  *(undefined8 *)&(this->super_torrent_alert).field_0x2c =
       *(undefined8 *)&(param_1->super_torrent_alert).field_0x2c;
  *(undefined8 *)&this->field_0x34 = uVar1;
  *(undefined8 *)&this->field_0x38 = uVar2;
  *(undefined8 *)&this->field_0x40 = uVar3;
  (this->m_url_idx).m_idx = (param_1->m_url_idx).m_idx;
  this->version = param_1->version;
  return;
}

Assistant:

struct TORRENT_EXPORT tracker_alert : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT tracker_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, tcp::endpoint const& ep, protocol_version v, string_view u);

#if TORRENT_ABI_VERSION == 1
		TORRENT_DEPRECATED static int const alert_type = 2;
#endif

		std::string message() const override;

		// endpoint of the listen interface being announced
		aux::noexcept_movable<tcp::endpoint> local_endpoint;

		// returns a 0-terminated string of the tracker's URL
		char const* tracker_url() const;

	private:
		aux::allocation_slot m_url_idx;
	public:
		// the bittorrent protocol version that was announced
		protocol_version version;
#if TORRENT_ABI_VERSION == 1
		// The tracker URL
		TORRENT_DEPRECATED std::string url;
#endif
	}